

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymdeltat.c
# Opt level: O1

void YM_DELTAT_ADPCM_Reset(YM_DELTAT *DELTAT,int pan)

{
  byte bVar1;
  
  DELTAT->now_addr = 0;
  DELTAT->now_step = 0;
  DELTAT->step = 0;
  DELTAT->start = 0;
  DELTAT->limit = 0xffffffff;
  DELTAT->end = 0;
  DELTAT->volume = 0;
  DELTAT->acc = 0;
  DELTAT->pan = DELTAT->output_pointer + pan;
  DELTAT->prev_acc = 0;
  DELTAT->adpcmd = 0x7f;
  DELTAT->adpcml = 0;
  if (DELTAT->emulation_mode == '\x01') {
    DELTAT->portstate = DELTAT->portstate & 0x20;
    DELTAT->control2 = DELTAT->control2 & 3;
  }
  else {
    DELTAT->portstate = '\0';
    DELTAT->control2 = '\0';
  }
  bVar1 = DELTAT->portshift_base - "\x03"[DELTAT->control2 & 3];
  DELTAT->now_portshift = bVar1;
  DELTAT->address_mask = (0x20000 << (bVar1 & 0x1f)) - 1;
  if ((DELTAT->status_set_handler != (STATUS_CHANGE_HANDLER)0x0) &&
     (DELTAT->status_change_BRDY_bit != '\0')) {
    (*DELTAT->status_set_handler)(DELTAT->status_change_which_chip,DELTAT->status_change_BRDY_bit);
    return;
  }
  return;
}

Assistant:

void YM_DELTAT_ADPCM_Reset(YM_DELTAT *DELTAT,int pan)
{
	DELTAT->now_addr  = 0;
	DELTAT->now_step  = 0;
	DELTAT->step      = 0;
	DELTAT->start     = 0;
	DELTAT->end       = 0;
	DELTAT->limit     = ~0; /* this way YM2610 and Y8950 (both of which don't have limit address reg) will still work */
	DELTAT->volume    = 0;
	DELTAT->pan       = &DELTAT->output_pointer[pan];
	DELTAT->acc       = 0;
	DELTAT->prev_acc  = 0;
	DELTAT->adpcmd    = 127;
	DELTAT->adpcml    = 0;
	if (DELTAT->emulation_mode == YM_DELTAT_EMULATION_MODE_YM2610)
	{
		DELTAT->portstate &= 0x20;
		DELTAT->control2  &= 0x03;
	}
	else
	{
		DELTAT->portstate = 0x00;
		DELTAT->control2  = 0x00;
	}
	DELTAT->now_portshift = DELTAT->portshift_base - dram_rightshift[DELTAT->control2 & 3];
	DELTAT->address_mask = (0x10000 << (DELTAT->now_portshift + 1)) - 1;

	/* The flag mask register disables the BRDY after the reset, however
	** as soon as the mask is enabled the flag needs to be set. */

	/* set BRDY bit in status register */
	if (DELTAT->status_set_handler != NULL && DELTAT->status_change_BRDY_bit)
		(DELTAT->status_set_handler)(DELTAT->status_change_which_chip, DELTAT->status_change_BRDY_bit);
}